

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

void __thiscall
JointPolicyPureVectorForClusteredBG::RecursivelyPrintPolicyForAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          stringstream *ss,Index agI,Index ts,Index last_ts,Index aohI,Index ohI,TypeCluster *tc,
          Index tI,Index aI,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  pointer ppJVar2;
  pointer psVar3;
  sp_counted_base *psVar4;
  MultiAgentDecisionProcessDiscreteInterface *pMVar5;
  Index aohI_00;
  Index ohIndex;
  Index tcI;
  uint aI_00;
  ulong uVar6;
  TypeCluster *tc_00;
  ostream *poVar7;
  Index in_stack_ffffffffffffff10;
  uint local_bc;
  string local_b8;
  stringstream *local_98;
  stringstream *local_90;
  element_type *local_88;
  shared_count sStack_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  JointPolicyPureVectorForClusteredBG *local_58;
  JointPolicyDiscretePure *local_50;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_48;
  
  uVar6 = (ulong)ts;
  ppJVar2 = (jpolBGVec->
            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_98 = ss;
  local_58 = this;
  if (uVar6 < (ulong)((long)(jpolBGVec->
                            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar2 >> 3)) {
    psVar3 = (bgVec->
             super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(bgVec->
                              super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)) {
      local_50 = ppJVar2[uVar6];
      psVar4 = psVar3[uVar6].pn.pi_;
      local_88 = psVar3[uVar6].px;
      sStack_80.pi_ = psVar3[uVar6].pn.pi_;
      if (psVar4 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar4->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_90 = ss + 0x10;
      local_bc = 0;
      while( true ) {
        pMVar5 = (pu->super_PlanningUnitMADPDiscrete)._m_madp;
        uVar6 = (**(code **)((long)*pMVar5 + 0xc0))(pMVar5,agI);
        if (uVar6 <= local_bc) break;
        aohI_00 = PlanningUnitMADPDiscrete::GetSuccessorAOHI
                            (&pu->super_PlanningUnitMADPDiscrete,agI,aohI,aI,local_bc);
        ohIndex = PlanningUnitMADPDiscrete::GetSuccessorOHI
                            (&pu->super_PlanningUnitMADPDiscrete,agI,ohI,local_bc);
        tcI = BayesianGameWithClusterInfo::FindTypeClusterIndex(local_88,agI,tc,aI,local_bc);
        tc_00 = BayesianGameWithClusterInfo::GetTypeCluster(local_88,agI,tcI);
        aI_00 = (**(code **)((long)(local_50->super_JointPolicyDiscrete).super_JointPolicy.
                                   _vptr_JointPolicy + 0x98))(local_50,agI,tcI);
        PlanningUnitMADPDiscrete::SoftPrintObservationHistory_abi_cxx11_
                  (&local_b8,&pu->super_PlanningUnitMADPDiscrete,agI,ohIndex);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_90,local_b8._M_dataplus._M_p,local_b8._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," -> ",4);
        (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xc])
                  (&local_78,pu,(ulong)agI,(ulong)aI_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_78,local_70);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (ts + 1 <= last_ts) {
          std::
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          ::vector(&local_48,bgVec);
          RecursivelyPrintPolicyForAgent
                    (local_58,pu,local_98,agI,ts + 1,last_ts,aohI_00,ohIndex,tc_00,
                     in_stack_ffffffffffffff10,aI_00,jpolBGVec,&local_48);
          std::
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          ::~vector(&local_48);
        }
        local_bc = local_bc + 1;
      }
      boost::detail::shared_count::~shared_count(&sStack_80);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void
JointPolicyPureVectorForClusteredBG::RecursivelyPrintPolicyForAgent(
        const PlanningUnitDecPOMDPDiscrete* pu
        , stringstream& ss
        , Index agI
        , Index ts
        , Index last_ts
        , Index aohI    //the previous aohI
        , Index ohI    //the previous ohI
        , const TypeCluster* tc //the previous typecluster that represents aohI
        , Index tI //the index of tc (in the previous bg)
        , Index aI //the action taken for tI (i.e. for aohI)
        , const vector<const JointPolicyDiscretePure* >& jpolBGVec
        , vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec
    )const 
{    
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure* jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);

#if DEBUG_RECURSIVE_SPRINT
    cout << ">>>Starting RecurivelyPrintPolicyForAgent for " << endl;
    cout << "agI="<<agI<<endl;
    cout << "ts="<<ts<<endl;
    cout << "aohI="<<aohI<<endl;
    cout << "ohI="<<ohI<<endl;
    cout << "tI="<<tI<<endl;
    cout << "aI="<<aI<<endl;
    //cout << "BG: " << endl << bg->SoftPrint();
    cout << endl;
#endif
    Index obsI = 0;
    for(obsI=0; obsI < pu->GetNrObservations(agI); obsI++)
    {
        Index n_aohI = pu->GetSuccessorAOHI(agI, aohI, aI, obsI);
        Index n_ohI = pu->GetSuccessorOHI(agI, ohI, obsI);
        ///NOTE: this can throw an error if there is no type 
        //for the history (e.g. if the histories prob. is 0)
        Index n_tI = 0;
        try{
            n_tI = bg->FindTypeClusterIndex(agI, tc, aI, obsI);
        } catch (E& e) {
            ss << pu->SoftPrintObservationHistory(agI, n_ohI) << 
                " *CAN'T OCCUR* -> ANY "<< endl;
            continue;
        }
        
        const TypeCluster* n_tc =  bg->GetTypeCluster(agI, n_tI);
        Index n_aI = jpolBG->GetActionIndex(agI, n_tI);
        ss << pu->SoftPrintObservationHistory(agI, n_ohI) << " -> " <<
            pu->SoftPrintAction(agI, n_aI) << endl;

        Index n_ts = ts+1;
        if(n_ts  <= last_ts) // ts + 1 <= h - 1
        {
            RecursivelyPrintPolicyForAgent(
                pu, ss, agI, n_ts, last_ts, n_aohI, n_ohI, 
                n_tc, n_tI, n_aI, jpolBGVec, bgVec);
        }
        else
        {
#if DEBUG_RECURSIVE_SPRINT
            cout << "this is last stage, no further RecurivelyPrintPolicyForAgent"<<endl;
#endif
        }
    }
}